

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O2

double Distance::getEuclideanDistance(PhyloTree *t1,PhyloTree *t2,bool normalise)

{
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  PhyloTreeEdge *pte;
  pointer this;
  PhyloTreeEdge *this_00;
  double dVar4;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> enic;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> eic;
  vector<double,_std::allocator<double>_> leaves1;
  vector<double,_std::allocator<double>_> leaves2;
  double local_a0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_98;
  double local_80;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  local_78.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (PhyloTreeEdge *)0x0;
  local_78.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (PhyloTreeEdge *)0x0;
  local_78.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhyloTree::getCommonEdges(t1,t2,&local_78);
  local_98.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (PhyloTreeEdge *)0x0;
  local_98.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (PhyloTreeEdge *)0x0;
  local_98.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhyloTree::getEdgesNotInCommonWith(t1,t2,&local_98);
  PhyloTree::getEdgesNotInCommonWith(t2,t1,&local_98);
  PhyloTree::getLeafEdgeLengths((vector<double,_std::allocator<double>_> *)&local_58,t1);
  PhyloTree::getLeafEdgeLengths((vector<double,_std::allocator<double>_> *)&local_40,t2);
  pPVar2 = local_78.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_a0 = 0.0;
  for (this = local_78.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
              super__Vector_impl_data._M_start;
      pPVar1 = local_98.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_finish,
      this_00 = local_98.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                super__Vector_impl_data._M_start, this != pPVar2; this = this + 1) {
    dVar4 = PhyloTreeEdge::getLength(this);
    local_a0 = local_a0 + dVar4 * dVar4;
  }
  for (; this_00 != pPVar1; this_00 = this_00 + 1) {
    dVar4 = PhyloTreeEdge::getLength(this_00);
    local_a0 = local_a0 + dVar4 * dVar4;
  }
  for (lVar3 = 0;
      (long)local_58._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3 != lVar3; lVar3 = lVar3 + 1) {
    local_a0 = local_a0 +
               (local_58._M_impl.super__Vector_impl_data._M_start[lVar3] -
               local_40._M_impl.super__Vector_impl_data._M_start[lVar3]) *
               (local_58._M_impl.super__Vector_impl_data._M_start[lVar3] -
               local_40._M_impl.super__Vector_impl_data._M_start[lVar3]);
  }
  if (local_a0 < 0.0) {
    local_a0 = sqrt(local_a0);
  }
  else {
    local_a0 = SQRT(local_a0);
  }
  if (normalise) {
    local_80 = PhyloTree::getDistanceFromOrigin(t1);
    dVar4 = PhyloTree::getDistanceFromOrigin(t2);
    local_a0 = local_a0 / (local_80 + dVar4);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_98);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_78);
  return local_a0;
}

Assistant:

double Distance::getEuclideanDistance(PhyloTree &t1, PhyloTree &t2, bool normalise) {
    double euc_value = 0;

    // Collect edges-in-common and edges-not-in-common...
    vector<PhyloTreeEdge> eic;
    PhyloTree::getCommonEdges(t1, t2, eic);
    vector<PhyloTreeEdge> enic;
    t1.getEdgesNotInCommonWith(t2, enic);
    t2.getEdgesNotInCommonWith(t1, enic);
    // ... and leaves
    vector<double> leaves1 = t1.getLeafEdgeLengths();
    vector<double> leaves2 = t2.getLeafEdgeLengths(); // Assuming these are the same

    // Collect length differences for internal edges...
    for (PhyloTreeEdge &pte : eic) {
        euc_value += pow(pte.getLength(), 2);
    }

    for (PhyloTreeEdge &pte : enic) {
        euc_value += pow(pte.getLength(), 2);
    }

    // ... and leaves
    for (int i = 0; i < leaves1.size(); i++) {
        euc_value += pow(leaves1[i] - leaves2[i], 2);
    }

    if (normalise) return sqrt(euc_value) / (t1.getDistanceFromOrigin() + t2.getDistanceFromOrigin());
    return sqrt(euc_value);
}